

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::~file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this)

{
  char **ppcVar1;
  bool bVar2;
  
  ppcVar1 = &((this->file_).super_file_base<_IO_FILE>.file_)->_IO_write_ptr;
  *ppcVar1 = *ppcVar1 + (this->super_buffer<char>).size_;
  bVar2 = glibc_file<_IO_FILE>::needs_flush(&this->file_);
  funlockfile((FILE *)(this->file_).super_file_base<_IO_FILE>.file_);
  if (bVar2) {
    fflush((FILE *)(this->file_).super_file_base<_IO_FILE>.file_);
    return;
  }
  return;
}

Assistant:

~file_print_buffer() {
    file_.advance_write_buffer(size());
    bool flush = file_.needs_flush();
    F* f = file_;    // Make funlockfile depend on the template parameter F
    funlockfile(f);  // for the system API detection to work.
    if (flush) fflush(file_);
  }